

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_stream_parser.cc
# Opt level: O2

Status * __thiscall
google::protobuf::util::converter::JsonStreamParser::ParseFalse
          (Status *__return_storage_ptr__,JsonStreamParser *this)

{
  (*this->ow_->_vptr_ObjectWriter[6])(this->ow_,(this->key_).ptr_,(this->key_).length_,0);
  (this->key_).ptr_ = (char *)0x0;
  (this->key_).length_ = 0;
  StringPiece::remove_prefix(&this->p_,DAT_003f2e00);
  Status::Status(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

util::Status JsonStreamParser::ParseFalse() {
  ow_->RenderBool(key_, false);
  key_ = StringPiece();
  p_.remove_prefix(kKeywordFalse.length());
  return util::Status();
}